

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml.c
# Opt level: O2

void av1_nn_predict_c(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  uint uVar1;
  uint uVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  int i;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float local_438 [258];
  
  uVar1 = nn_config->num_hidden_layers;
  uVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  uVar6 = 0;
  uVar7 = nn_config->num_inputs;
  for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
    pfVar10 = nn_config->weights[uVar9];
    pfVar3 = nn_config->bias[uVar9];
    lVar4 = uVar6 * 0x80;
    uVar2 = nn_config->num_hidden_nodes[uVar9];
    uVar13 = 0;
    if (0 < (int)uVar7) {
      uVar13 = (ulong)uVar7;
    }
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    for (uVar5 = 0; uVar5 != uVar8; uVar5 = uVar5 + 1) {
      fVar14 = pfVar3[uVar5];
      for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        fVar14 = fVar14 + pfVar10[uVar12] * input_nodes[uVar12];
      }
      if (fVar14 <= 0.0) {
        fVar14 = 0.0;
      }
      (local_438 + lVar4)[uVar5] = fVar14;
      pfVar10 = pfVar10 + (int)uVar7;
    }
    uVar6 = (ulong)(1 - (int)uVar6);
    input_nodes = local_438 + lVar4;
    uVar7 = uVar2;
  }
  pfVar10 = nn_config->weights[(int)uVar1];
  pfVar3 = nn_config->bias[(int)uVar1];
  uVar1 = nn_config->num_outputs;
  uVar9 = 0;
  uVar11 = 0;
  if (0 < (int)uVar7) {
    uVar11 = (ulong)uVar7;
  }
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    fVar14 = pfVar3[uVar9];
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      fVar14 = fVar14 + pfVar10[uVar13] * input_nodes[uVar13];
    }
    output[uVar9] = fVar14;
    pfVar10 = pfVar10 + (int)uVar7;
  }
  if (reduce_prec == 0) {
    return;
  }
  av1_nn_output_prec_reduce(output,uVar1);
  return;
}

Assistant:

void av1_nn_predict_c(const float *input_nodes,
                      const NN_CONFIG *const nn_config, int reduce_prec,
                      float *const output) {
  int num_input_nodes = nn_config->num_inputs;
  int buf_index = 0;
  float buf[2][NN_MAX_NODES_PER_LAYER];

  // Propagate hidden layers.
  const int num_layers = nn_config->num_hidden_layers;
  assert(num_layers <= NN_MAX_HIDDEN_LAYERS);
  for (int layer = 0; layer < num_layers; ++layer) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    float *output_nodes = buf[buf_index];
    const int num_output_nodes = nn_config->num_hidden_nodes[layer];
    assert(num_output_nodes < NN_MAX_NODES_PER_LAYER);
    for (int node = 0; node < num_output_nodes; ++node) {
      float val = layer_bias[node];
      for (int i = 0; i < num_input_nodes; ++i)
        val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
      // ReLU as activation function.
      val = val > 0.0f ? val : 0.0f;  // Could use AOMMAX().
      output_nodes[node] = val;
    }
    num_input_nodes = num_output_nodes;
    input_nodes = output_nodes;
    buf_index = 1 - buf_index;
  }

  // Final output layer.
  const float *layer_weights = nn_config->weights[num_layers];
  const float *layer_bias = nn_config->bias[num_layers];
  for (int node = 0; node < nn_config->num_outputs; ++node) {
    float val = layer_bias[node];
    for (int i = 0; i < num_input_nodes; ++i)
      val += layer_weights[node * num_input_nodes + i] * input_nodes[i];
    output[node] = val;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}